

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t decode_one(aom_codec_alg_priv_t *ctx,uint8_t **data,size_t data_sz,void *user_priv)

{
  undefined8 uVar1;
  aom_codec_err_t aVar2;
  aom_codec_alg_priv_t *ctx_00;
  uint8_t *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  aom_codec_err_t res;
  int is_intra_only;
  AVxWorkerInterface *winterface;
  int *in_stack_00000070;
  aom_codec_stream_info_t *in_stack_00000078;
  size_t in_stack_00000080;
  uint8_t *in_stack_00000088;
  AV1Decoder *pbi;
  aom_codec_alg_priv_t *ctx_01;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  aom_codec_err_t local_4;
  
  ctx_00 = (aom_codec_alg_priv_t *)aom_get_worker_interface();
  if (*(int *)(in_RDI + 0xe4) == 0) {
    in_stack_ffffffffffffffcc = 0;
    *(undefined4 *)(in_RDI + 0xf4) = *(undefined4 *)(in_RDI + 0x69e0);
    aVar2 = decoder_peek_si_internal
                      (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    if (aVar2 != AOM_CODEC_OK) {
      return aVar2;
    }
    if ((*(int *)(in_RDI + 0xe8) == 0) && (in_stack_ffffffffffffffcc == 0)) {
      return AOM_CODEC_ERROR;
    }
    in_stack_ffffffffffffffc8 = 0;
  }
  ctx_01 = *(aom_codec_alg_priv_t **)(in_RDI + 0x69f0);
  pbi = *(AV1Decoder **)&(ctx_01->base).enc.cx_data_pad_before;
  uVar1 = *in_RSI;
  (pbi->dcb).xd.mi_stride = (int)uVar1;
  (pbi->dcb).xd.is_chroma_ref = (_Bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&(pbi->dcb).xd.field_0xd = (int3)((ulong)uVar1 >> 0x28);
  *(undefined8 *)&(pbi->dcb).xd.plane[0].subsampling_y = in_RDX;
  (pbi->dcb).xd.plane[0].dst.buf = in_RCX;
  *(undefined4 *)&(pbi->dcb).xd.plane[0].dst.buf0 = 1;
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x9e44) = *(undefined4 *)(in_RDI + 0x1cc);
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x58da0) = *(undefined4 *)(in_RDI + 0x1c4);
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x58da4) = *(undefined4 *)(in_RDI + 0x1c8);
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x58df0) = *(undefined4 *)(in_RDI + 0x1d0);
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x58df4) = *(undefined4 *)(in_RDI + 0x1d4);
  memcpy((void *)(*(long *)&(pbi->dcb).xd + 0x58df8),(void *)(in_RDI + 0x1d8),0x6808);
  *(undefined4 *)(*(long *)&(pbi->dcb).xd + 0x5f72c) = *(undefined4 *)(in_RDI + 0x69e0);
  (ctx_01->base).enc.cx_data_pkt.data.psnr.samples[0] = 0;
  (**(_func_void_AVxWorker_ptr **)&(ctx_00->base).enc.cx_data_pad_before)((AVxWorker *)ctx_01);
  *in_RSI = *(undefined8 *)(pbi->dcb).xd.plane;
  if ((ctx_01->base).enc.cx_data_pkt.data.psnr.samples[0] == 0) {
    check_resync(ctx_01,pbi);
    local_4 = AOM_CODEC_OK;
  }
  else {
    local_4 = update_error_state(ctx_00,(aom_internal_error_info *)
                                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
  }
  return local_4;
}

Assistant:

static aom_codec_err_t decode_one(aom_codec_alg_priv_t *ctx,
                                  const uint8_t **data, size_t data_sz,
                                  void *user_priv) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  // Determine the stream parameters. Note that we rely on peek_si to
  // validate that we have a buffer that does not wrap around the top
  // of the heap.
  if (!ctx->si.h) {
    int is_intra_only = 0;
    ctx->si.is_annexb = ctx->is_annexb;
    const aom_codec_err_t res =
        decoder_peek_si_internal(*data, data_sz, &ctx->si, &is_intra_only);
    if (res != AOM_CODEC_OK) return res;

    if (!ctx->si.is_kf && !is_intra_only) return AOM_CODEC_ERROR;
  }

  AVxWorker *const worker = ctx->frame_worker;
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
  frame_worker_data->data = *data;
  frame_worker_data->data_size = data_sz;
  frame_worker_data->user_priv = user_priv;
  frame_worker_data->received_frame = 1;

  frame_worker_data->pbi->common.tiles.large_scale = ctx->tile_mode;
  frame_worker_data->pbi->dec_tile_row = ctx->decode_tile_row;
  frame_worker_data->pbi->dec_tile_col = ctx->decode_tile_col;
  frame_worker_data->pbi->ext_tile_debug = ctx->ext_tile_debug;
  frame_worker_data->pbi->row_mt = ctx->row_mt;
  frame_worker_data->pbi->ext_refs = ctx->ext_refs;

  frame_worker_data->pbi->is_annexb = ctx->is_annexb;

  worker->had_error = 0;
  winterface->execute(worker);

  // Update data pointer after decode.
  *data = frame_worker_data->data_end;

  if (worker->had_error)
    return update_error_state(ctx, &frame_worker_data->pbi->error);

  check_resync(ctx, frame_worker_data->pbi);

  return AOM_CODEC_OK;
}